

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimc.c
# Opt level: O3

int levmar(custom_funcmult *funcmult,custom_jacobian *jacobian,double *xi,int M,int N,double *xf)

{
  int iVar1;
  double *fvec;
  double *fjac;
  double *diag;
  double *qtf;
  int *ipvt;
  undefined4 in_register_0000000c;
  ulong uVar2;
  long lVar3;
  double __x;
  double gtol;
  int local_40 [2];
  int nfev;
  int njev;
  
  _nfev = CONCAT44(in_register_0000000c,M);
  fvec = (double *)malloc((long)M * 8);
  lVar3 = (long)N;
  fjac = (double *)malloc((long)M * 8 * lVar3);
  diag = (double *)malloc(lVar3 * 8);
  qtf = (double *)malloc(lVar3 * 8);
  ipvt = (int *)malloc(lVar3 * 4);
  __x = macheps();
  gtol = pow(__x,0.3333333333333333);
  local_40[1] = 0;
  local_40[0] = 0;
  if (0 < N) {
    uVar2 = 0;
    do {
      xf[uVar2] = xi[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  iVar1 = (int)_nfev;
  if (jacobian == (custom_jacobian *)0x0) {
    iVar1 = lmdif(funcmult,xf,iVar1,N,fvec,fjac,iVar1,1000,diag,1,100.0,0,__x,__x,gtol * gtol,gtol,
                  __x,local_40,local_40 + 1,ipvt,qtf);
  }
  else {
    iVar1 = lmder(funcmult,jacobian,xf,iVar1,N,fvec,fjac,iVar1,1000,diag,1,100.0,0,__x,gtol * gtol,
                  gtol,__x,local_40,local_40 + 1,ipvt,qtf);
  }
  _nfev = CONCAT44(njev,iVar1);
  free(fvec);
  free(fjac);
  free(diag);
  free(qtf);
  free(ipvt);
  return nfev;
}

Assistant:

int levmar(custom_funcmult *funcmult, custom_jacobian *jacobian,
		double *xi,int M, int N,double *xf) {
	int info,i;
	double *fvec,*fjac,*diag,*qtf;
	int ldfjac,mode,nfev,njev,nprint,maxfev;
	int *ipvt;
	double factor,eps,epsfcn,ftol,gtol,xtol;

	fvec = (double*) malloc(sizeof(double) *M);
	fjac = (double*) malloc(sizeof(double) *M * N);
	diag = (double*) malloc(sizeof(double) *N);
	qtf = (double*) malloc(sizeof(double) *N);
	ipvt = (int*) malloc(sizeof(int) *N);

	eps = macheps();
	epsfcn = eps;
	gtol = pow(eps,1.0/3.0);
	ftol = gtol * gtol;
	xtol = eps;
	factor = 100.;
	ldfjac = M;
	nfev = njev = nprint = 0;
	mode = 1;
	maxfev = 1000;

	for(i = 0; i < N;++i) {
		xf[i] = xi[i];
	}

	if (jacobian == NULL) {
		info = lmdif(funcmult,xf,M,N,fvec,fjac,ldfjac,maxfev,diag,mode,factor,nprint,eps,epsfcn,ftol,gtol,
				xtol,&nfev,&njev,ipvt,qtf);
	} else {
		info = lmder(funcmult,jacobian,xf,M,N,fvec,fjac,ldfjac,maxfev,diag,mode,factor,nprint,eps,ftol,gtol,
				xtol,&nfev,&njev,ipvt,qtf);
	}


	free(fvec);
	free(fjac);
	free(diag);
	free(qtf);
	free(ipvt);

	return info;
}